

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  undefined8 *in_RSI;
  int in_EDI;
  DataReaderFromEmpty dr;
  NetOptimize optimizer;
  int flag;
  char *outbin;
  char *outparam;
  char *inbin;
  char *inparam;
  NetOptimize *in_stack_00000890;
  NetOptimize *in_stack_000008a0;
  char *in_stack_00000d30;
  char *in_stack_00000d38;
  NetOptimize *in_stack_00000d40;
  DataReaderFromEmpty local_c8;
  char *in_stack_ffffffffffffff40;
  Net *in_stack_ffffffffffffff48;
  NetOptimize *in_stack_ffffffffffffff50;
  NetOptimize *in_stack_ffffffffffffff70;
  NetOptimize *in_stack_ffffffffffffff80;
  Net *in_stack_ffffffffffffff88;
  NetOptimize *in_stack_ffffffffffffff90;
  NetOptimize *in_stack_ffffffffffffffa0;
  int local_4;
  
  if (in_EDI == 6) {
    __s1 = (char *)in_RSI[2];
    atoi((char *)in_RSI[5]);
    NetOptimize::NetOptimize((NetOptimize *)0x120e20);
    ncnn::Net::load_param(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    iVar1 = strcmp(__s1,"null");
    if (iVar1 == 0) {
      DataReaderFromEmpty::DataReaderFromEmpty(&local_c8);
      ncnn::Net::load_model(in_stack_ffffffffffffff88,(DataReader *)in_stack_ffffffffffffff80);
      DataReaderFromEmpty::~DataReaderFromEmpty((DataReaderFromEmpty *)0x120e99);
    }
    else {
      ncnn::Net::load_model(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    }
    NetOptimize::fuse_batchnorm_scale(in_stack_ffffffffffffff90);
    NetOptimize::fuse_convolution_batchnorm((NetOptimize *)inparam);
    NetOptimize::fuse_convolutiondepthwise_batchnorm((NetOptimize *)inparam);
    NetOptimize::fuse_deconvolution_batchnorm((NetOptimize *)inparam);
    NetOptimize::fuse_deconvolutiondepthwise_batchnorm((NetOptimize *)inparam);
    NetOptimize::fuse_innerproduct_batchnorm((NetOptimize *)inparam);
    NetOptimize::fuse_innerproduct_dropout(in_stack_ffffffffffffffa0);
    NetOptimize::fuse_convolution_activation((NetOptimize *)optimizer.super_Net.opt.blob_allocator);
    NetOptimize::fuse_convolutiondepthwise_activation
              ((NetOptimize *)optimizer.super_Net.opt.blob_allocator);
    NetOptimize::fuse_deconvolution_activation
              ((NetOptimize *)optimizer.super_Net.opt.blob_allocator);
    NetOptimize::fuse_deconvolutiondepthwise_activation
              ((NetOptimize *)optimizer.super_Net.opt.blob_allocator);
    NetOptimize::fuse_innerproduct_activation((NetOptimize *)optimizer.super_Net.opt.blob_allocator)
    ;
    NetOptimize::eliminate_dropout(in_stack_ffffffffffffff70);
    NetOptimize::eliminate_pooling1x1(in_stack_ffffffffffffff80);
    NetOptimize::eliminate_noop(in_stack_ffffffffffffffa0);
    NetOptimize::eliminate_flatten_after_global_pooling(in_stack_ffffffffffffff70);
    NetOptimize::eliminate_reshape_after_global_pooling(in_stack_ffffffffffffff70);
    NetOptimize::eliminate_reshape_before_binaryop(in_stack_ffffffffffffffa0);
    NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(in_stack_00000890);
    NetOptimize::replace_convolution_with_innerproduct_after_innerproduct(in_stack_000008a0);
    NetOptimize::eliminate_flatten_after_innerproduct(in_stack_ffffffffffffff70);
    NetOptimize::eliminate_orphaned_memorydata(in_stack_ffffffffffffff50);
    NetOptimize::save(in_stack_00000d40,in_stack_00000d38,in_stack_00000d30);
    local_4 = 0;
    NetOptimize::~NetOptimize((NetOptimize *)0x12101a);
  }
  else {
    fprintf(_stderr,"usage: %s [inparam] [inbin] [outparam] [outbin] [flag]\n",*in_RSI);
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int main(int argc, char** argv)
{
#if defined(__aarch64__) && defined(LINUX)
    if (argc != 10)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [flag] [dataname] [w] [h] [c]\n", argv[0]);
        return -1;
    }
    const char* dataname = argv[6];
    int inw = atoi(argv[7]);
    int inh = atoi(argv[8]);
    int inc = atoi(argv[9]);
#else
    if (argc != 6)
    {
        fprintf(stderr, "usage: %s [inparam] [inbin] [outparam] [outbin] [flag]\n", argv[0]);
        return -1;
    }
#endif // defined(__aarch64__) && defined(LINUX)

    const char* inparam = argv[1];
    const char* inbin = argv[2];
    const char* outparam = argv[3];
    const char* outbin = argv[4];
    int flag = atoi(argv[5]);

    NetOptimize optimizer;

    if (flag == 1)
    {
        optimizer.storage_type = 1;
    }
    else
    {
        optimizer.storage_type = 0;
    }

    optimizer.load_param(inparam);
    if (strcmp(inbin, "null") == 0)
    {
        DataReaderFromEmpty dr;
        optimizer.load_model(dr);
    }
    else
        optimizer.load_model(inbin);

#if defined(__aarch64__) && defined(LINUX)
    optimizer.find_fastest_fp32_conv(dataname, inw, inh, inc);
#endif // defined(__aarch64__) && defined(LINUX)
    optimizer.fuse_batchnorm_scale();
    optimizer.fuse_convolution_batchnorm();
    optimizer.fuse_convolutiondepthwise_batchnorm();
    optimizer.fuse_deconvolution_batchnorm();
    optimizer.fuse_deconvolutiondepthwise_batchnorm();
    optimizer.fuse_innerproduct_batchnorm();
    optimizer.fuse_innerproduct_dropout();
    optimizer.fuse_convolution_activation();
    optimizer.fuse_convolutiondepthwise_activation();
    optimizer.fuse_deconvolution_activation();
    optimizer.fuse_deconvolutiondepthwise_activation();
    optimizer.fuse_innerproduct_activation();

    optimizer.eliminate_dropout();
    optimizer.eliminate_pooling1x1();
    optimizer.eliminate_noop();
    optimizer.eliminate_flatten_after_global_pooling();
    optimizer.eliminate_reshape_after_global_pooling();
    optimizer.eliminate_reshape_before_binaryop();

    optimizer.replace_convolution_with_innerproduct_after_global_pooling();
    optimizer.replace_convolution_with_innerproduct_after_innerproduct();

    optimizer.eliminate_flatten_after_innerproduct();
    optimizer.eliminate_orphaned_memorydata();

    optimizer.save(outparam, outbin);

    return 0;
}